

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall libcellml::Model::removeAllUnits(Model *this)

{
  bool bVar1;
  ModelImpl *pMVar2;
  __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  UnitsImpl *this_02;
  shared_ptr<libcellml::Units> *u;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  *__range1;
  Model *this_local;
  
  pMVar2 = pFunc(this);
  __end1 = std::
           vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
           ::begin(&pMVar2->mUnits);
  u = (shared_ptr<libcellml::Units> *)
      std::
      vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
      ::end(&pMVar2->mUnits);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                                *)&u);
    if (!bVar1) break;
    this_00 = (__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
              ::operator*(&__end1);
    this_01 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    this_02 = Units::pFunc(this_01);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_02);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
    ::operator++(&__end1);
  }
  pMVar2 = pFunc(this);
  std::
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
  clear(&pMVar2->mUnits);
  return;
}

Assistant:

void Model::removeAllUnits()
{
    for (const auto &u : pFunc()->mUnits) {
        u->pFunc()->removeParent();
    }
    pFunc()->mUnits.clear();
}